

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O2

StringTree * __thiscall
kj::
strTree<char_const(&)[17],kj::StringTree,char_const(&)[7],kj::StringPtr&,char_const(&)[32],kj::StringPtr&,char_const(&)[183],kj::Array<kj::StringTree>,char_const(&)[192]>
          (StringTree *__return_storage_ptr__,kj *this,char (*params) [17],StringTree *params_1,
          char (*params_2) [7],StringPtr *params_3,char (*params_4) [32],StringPtr *params_5,
          char (*params_6) [183],Array<kj::StringTree> *params_7,char (*params_8) [192])

{
  ArrayPtr<const_char> AVar1;
  ArrayPtr<const_char> *params_8_00;
  ArrayPtr<const_char> local_c8;
  ArrayPtr<const_char> local_b8;
  ArrayPtr<const_char> local_a8;
  ArrayPtr<const_char> local_98;
  ArrayPtr<const_char> local_88;
  ArrayPtr<const_char> local_78;
  StringTree local_68;
  
  local_88 = toCharSequence<char_const(&)[17]>((char (*) [17])this);
  local_98 = toCharSequence<char_const(&)[7]>((char (*) [7])params_1);
  local_a8.ptr = *(char **)params_2;
  local_a8.size_ = *(long *)(params_2[1] + 1) - 1;
  local_b8 = toCharSequence<char_const(&)[32]>((char (*) [32])params_3);
  local_c8.ptr = *(char **)*params_4;
  local_c8.size_ = *(long *)(*params_4 + 8) - 1;
  AVar1 = toCharSequence<char_const(&)[183]>((char (*) [183])params_5);
  params_8_00 = (ArrayPtr<const_char> *)AVar1.ptr;
  operator*(&local_68,params_6);
  local_78 = toCharSequence<char_const(&)[192]>((char (*) [192])params_7);
  StringTree::
  concat<kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(StringTree *)&local_88,(ArrayPtr<const_char> *)params,
             (StringTree *)&local_98,&local_a8,&local_b8,&local_c8,
             (ArrayPtr<const_char> *)&stack0xffffffffffffff28,(ArrayPtr<const_char> *)&local_68,
             (StringTree *)&local_78,params_8_00);
  StringTree::~StringTree(&local_68);
  return __return_storage_ptr__;
}

Assistant:

StringTree strTree(Params&&... params) {
  return StringTree::concat(_::toStringTreeOrCharSequence(kj::fwd<Params>(params))...);
}